

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

bool rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
     Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,true,false>>
               (NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                *is,Ch expect)

{
  Ch CVar1;
  Ch expect_local;
  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
  *is_local;
  
  CVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
          ::Peek(&is->
                  super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                );
  if (CVar1 == expect) {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
    ::Take(&is->
            super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
          );
  }
  return CVar1 == expect;
}

Assistant:

RAPIDJSON_FORCEINLINE static bool Consume(InputStream& is, typename InputStream::Ch expect) {
        if (RAPIDJSON_LIKELY(is.Peek() == expect)) {
            is.Take();
            return true;
        }
        else
            return false;
    }